

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall
picojson::default_parse_context::
parse_array_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (default_parse_context *this,
          input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in,size_t param_2)

{
  bool bVar1;
  array *this_00;
  default_parse_context ctx;
  value local_28;
  
  this_00 = value::get<std::vector<picojson::value,std::allocator<picojson::value>>>(this->out_);
  local_28._0_8_ = (ulong)(uint)local_28._4_4_ << 0x20;
  local_28.u_.number_ = 0.0;
  std::vector<picojson::value,_std::allocator<picojson::value>_>::emplace_back<picojson::value>
            (this_00,&local_28);
  value::clear(&local_28);
  local_28._0_8_ =
       (this_00->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
       super__Vector_impl_data._M_finish + -1;
  bVar1 = _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((default_parse_context *)&local_28,in);
  return bVar1;
}

Assistant:

bool parse_array_item(input<Iter> &in, size_t) {
    array &a = out_->get<array>();
    a.push_back(value());
    default_parse_context ctx(&a.back());
    return _parse(ctx, in);
  }